

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O1

void Gia_ManCollectAnds(Gia_Man_t *p,int *pNodes,int nNodes,Vec_Int_t *vNodes)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  vNodes->nSize = 0;
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (0 < p->nTravIdsAlloc) {
    *p->pTravIds = p->nTravIds;
    if (0 < nNodes) {
      uVar5 = 0;
      do {
        iVar1 = pNodes[uVar5];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar2 = *(ulong *)(p->pObjs + iVar1);
        uVar3 = uVar2 & 0x1fffffff;
        uVar4 = 0;
        if (uVar3 != 0x1fffffff) {
          uVar4 = -uVar3;
        }
        Gia_ManCollectAnds_rec(p,p->pObjs + iVar1 + (uVar4 & (long)(int)uVar2 >> 0x1f),vNodes);
        uVar5 = uVar5 + 1;
      } while ((uint)nNodes != uVar5);
    }
    return;
  }
  __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x227,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManCollectAnds( Gia_Man_t * p, int * pNodes, int nNodes, Vec_Int_t * vNodes )
{
    Gia_Obj_t * pObj;
    int i; 
    Vec_IntClear( vNodes );
//    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectAnds_rec( p, Gia_ObjFanin0(pObj), vNodes );
        else
            Gia_ManCollectAnds_rec( p, pObj, vNodes );
    }
}